

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::error(CScanner *this,TError error,char c)

{
  ostream *poVar1;
  ostringstream *this_00;
  char *pcVar2;
  string wrongText;
  string local_1c0;
  ostringstream errorStream;
  
  this_00 = (ostringstream *)&errorStream;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if (E_UnexpectedCharacterInQualifier < error) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x8e,"void Refal2::CScanner::error(TError, char)");
  }
  switch(error) {
  case E_InvalidCharacter:
    pcVar2 = "invalid character `";
    goto LAB_00134041;
  case E_InvalidControlCharacter:
    poVar1 = std::operator<<((ostream *)&errorStream,"invalid control character with ASCII code ");
    pcVar2 = "`";
    poVar1 = std::operator<<(poVar1,"`");
    this_00 = (ostringstream *)std::ostream::operator<<((ostream *)poVar1,(int)c);
    break;
  case E_UnexpectedCharacter:
    pcVar2 = "unexpected character `";
LAB_00134041:
    poVar1 = std::operator<<((ostream *)&errorStream,pcVar2);
    this_00 = (ostringstream *)std::operator<<(poVar1,c);
    pcVar2 = "`";
    break;
  case E_UnclosedMultilineCommentAtTheEndOfFile:
    pcVar2 = "unclosed multiline comment at the end of file";
    break;
  case E_UnclosedString:
    pcVar2 = "unclosed string";
    break;
  case E_UnclosedLabel:
    pcVar2 = "unclosed label";
    break;
  case E_UnexpectedCharacterInLabel:
    pcVar2 = "unexpected character in label";
    break;
  case E_UnclosedNumber:
    pcVar2 = "unclosed number";
    break;
  case E_UnclosedQualifier:
    pcVar2 = "unclosed qualifier";
    break;
  case E_UnexpectedCharacterInQualifier:
    pcVar2 = "unexpected character in qualifier";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  if (c == '\n') {
    std::__cxx11::string::string((string *)&wrongText,"",(allocator *)&local_1c0);
  }
  else {
    wrongText._M_dataplus._M_p = (pointer)&wrongText.field_2;
    std::__cxx11::string::_M_construct((ulong)&wrongText,'\x01');
  }
  CError::SetTokenData((CError *)this,this->line,this->position,&wrongText);
  std::__cxx11::stringbuf::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  CError::ResetToken((CError *)this);
  std::__cxx11::string::~string((string *)&wrongText);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorStream);
  return;
}

Assistant:

void CScanner::error( TError error, char c )
{
	std::ostringstream errorStream;
	switch( error ) {
		case E_InvalidCharacter:
			errorStream << "invalid character `" << c << "`";
			break;
		case E_InvalidControlCharacter:
			errorStream << "invalid control character with ASCII code "
				<< "`" << static_cast<int>( c ) << "`";
			break;
		case E_UnexpectedCharacter:
			errorStream << "unexpected character `" << c << "`";
			break;
		case E_UnclosedMultilineCommentAtTheEndOfFile:
			errorStream << "unclosed multiline comment at the end of file";
			break;
		case E_UnclosedString:
			errorStream << "unclosed string";
			break;
		case E_UnclosedLabel:
			errorStream << "unclosed label";
			break;
		case E_UnexpectedCharacterInLabel:
			errorStream << "unexpected character in label";
			break;
		case E_UnclosedNumber:
			errorStream << "unclosed number";
			break;
		case E_UnclosedQualifier:
			errorStream << "unclosed qualifier";
			break;
		case E_UnexpectedCharacterInQualifier:
			errorStream << "unexpected character in qualifier";
			break;
		default:
			assert( false );
			break;
	}
	const std::string wrongText = ( c == '\n' ? "" : std::string( 1, c ) );
	CError::SetTokenData( line, position, wrongText );
	CErrorsHelper::RaiseError( ES_Error, errorStream.str() );
	CError::ResetToken();
}